

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_end(END_HANDLE end)

{
  END_INSTANCE *end_instance;
  AMQP_VALUE result;
  END_HANDLE end_local;
  
  if (end == (END_HANDLE)0x0) {
    end_instance = (END_INSTANCE *)0x0;
  }
  else {
    end_instance = (END_INSTANCE *)amqpvalue_clone(end->composite_value);
  }
  return (AMQP_VALUE)end_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_end(END_HANDLE end)
{
    AMQP_VALUE result;

    if (end == NULL)
    {
        result = NULL;
    }
    else
    {
        END_INSTANCE* end_instance = (END_INSTANCE*)end;
        result = amqpvalue_clone(end_instance->composite_value);
    }

    return result;
}